

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::delete_view(Group *this,const_iterator *v)

{
  undefined1 uVar1;
  uint uVar2;
  pointer pvVar3;
  View *pVVar4;
  Code *pCVar5;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_a0;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_98;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_90;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_88;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_80;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_78;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_70;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_68;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_60;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_58;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_50;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_48;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_20;
  const_iterator *local_18;
  const_iterator *v_local;
  Group *this_local;
  
  local_18 = v;
  v_local = (const_iterator *)this;
  pvVar3 = std::__detail::
           _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
           ::operator->(v);
  pVVar4 = core::P<r_exec::View>::operator->(&pvVar3->second);
  uVar2 = (*(pVVar4->super_View).super__Object._vptr__Object[2])();
  if ((uVar2 & 1) == 0) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
             ::operator->(local_18);
    pVVar4 = core::P<r_exec::View>::operator->(&pvVar3->second);
    pCVar5 = core::P<r_code::Code>::operator->(&(pVVar4->super_View).object);
    (*(pCVar5->super__Object)._vptr__Object[4])(pCVar5,0);
    uVar1 = r_code::Atom::getDescriptor();
    switch(uVar1) {
    case 0xc3:
    case 0xc4:
      local_90._M_cur =
           (local_18->
           super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
           ._M_cur;
      local_88._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
           ::erase(&this->other_views,local_90._M_cur);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
      _Node_const_iterator
                ((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&local_80,
                 (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&local_88);
      (local_18->
      super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>).
      _M_cur = local_80._M_cur;
      break;
    case 200:
      local_a0._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
           ::erase(&this->group_views,
                   (local_18->
                   super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                   )._M_cur);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
      _Node_const_iterator
                ((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&local_98,
                 (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&local_a0);
      (local_18->
      super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>).
      _M_cur = local_98._M_cur;
      break;
    case 0xc9:
    case 0xca:
    case 0xcd:
    case 0xce:
    case 0xcf:
      local_48._M_cur =
           (local_18->
           super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
           ._M_cur;
      local_40._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
           ::erase(&this->ipgm_views,local_48._M_cur);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
      _Node_const_iterator
                ((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&local_38,
                 (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&local_40);
      (local_18->
      super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>).
      _M_cur = local_38._M_cur;
      break;
    case 0xcb:
      local_78._M_cur =
           (local_18->
           super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
           ._M_cur;
      local_70._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
           ::erase(&this->input_less_ipgm_views,local_78._M_cur);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
      _Node_const_iterator
                ((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&local_68,
                 (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&local_70);
      (local_18->
      super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>).
      _M_cur = local_68._M_cur;
      break;
    case 0xcc:
      local_60._M_cur =
           (local_18->
           super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
           ._M_cur;
      local_58._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
           ::erase(&this->anti_ipgm_views,local_60._M_cur);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
      _Node_const_iterator
                ((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&local_50,
                 (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&local_58);
      (local_18->
      super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>).
      _M_cur = local_50._M_cur;
    }
  }
  else {
    local_30._M_cur =
         (local_18->
         super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>).
         _M_cur;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
         ::erase(&this->notification_views,local_30._M_cur);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                *)&local_20,
               (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                *)&local_28);
    (local_18->
    super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)._M_cur
         = local_20._M_cur;
  }
  return;
}

Assistant:

void Group::delete_view(std::unordered_map<uint64_t, P<View> >::const_iterator &v)
{
    if (v->second->isNotification()) {
        v = notification_views.erase(v);
    } else switch (v->second->object->code(0).getDescriptor()) {
        case Atom::NULL_PROGRAM:
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
            v = ipgm_views.erase(v);
            break;

        case Atom::INSTANTIATED_ANTI_PROGRAM:
            v = anti_ipgm_views.erase(v);
            break;

        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
            v = input_less_ipgm_views.erase(v);
            break;

        case Atom::OBJECT:
        case Atom::MARKER:
            v = other_views.erase(v);
            break;

        case Atom::GROUP:
            v = group_views.erase(v);
            break;
        }
}